

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

void Assimp::Write(JSONWriter *out,aiScene *ai)

{
  uint n;
  ulong uVar1;
  allocator<char> local_41;
  string local_40;
  
  JSONWriter::StartObj(out,false);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"__metadata__",&local_41);
  JSONWriter::Key(out,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  WriteFormatInfo(out);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"rootnode",&local_41);
  JSONWriter::Key(out,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Write(out,ai->mRootNode,false);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"flags",&local_41);
  JSONWriter::Key(out,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  JSONWriter::SimpleValue<unsigned_int>(out,&ai->mFlags);
  if ((ai->mMeshes != (aiMesh **)0x0) && (ai->mNumMeshes != 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"meshes",&local_41);
    JSONWriter::Key(out,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    JSONWriter::StartArray(out,false);
    for (uVar1 = 0; uVar1 < ai->mNumMeshes; uVar1 = uVar1 + 1) {
      Write(out,ai->mMeshes[uVar1],true);
    }
    JSONWriter::EndArray(out);
  }
  if ((ai->mMaterials != (aiMaterial **)0x0) && (ai->mNumMaterials != 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"materials",&local_41);
    JSONWriter::Key(out,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    JSONWriter::StartArray(out,false);
    for (uVar1 = 0; uVar1 < ai->mNumMaterials; uVar1 = uVar1 + 1) {
      Write(out,ai->mMaterials[uVar1],true);
    }
    JSONWriter::EndArray(out);
  }
  if ((ai->mAnimations != (aiAnimation **)0x0) && (ai->mNumAnimations != 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"animations",&local_41);
    JSONWriter::Key(out,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    JSONWriter::StartArray(out,false);
    for (uVar1 = 0; uVar1 < ai->mNumAnimations; uVar1 = uVar1 + 1) {
      Write(out,ai->mAnimations[uVar1],true);
    }
    JSONWriter::EndArray(out);
  }
  if ((ai->mLights != (aiLight **)0x0) && (ai->mNumLights != 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"lights",&local_41);
    JSONWriter::Key(out,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    JSONWriter::StartArray(out,false);
    for (uVar1 = 0; uVar1 < ai->mNumLights; uVar1 = uVar1 + 1) {
      Write(out,ai->mLights[uVar1],true);
    }
    JSONWriter::EndArray(out);
  }
  if ((ai->mCameras != (aiCamera **)0x0) && (ai->mNumCameras != 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"cameras",&local_41);
    JSONWriter::Key(out,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    JSONWriter::StartArray(out,false);
    for (uVar1 = 0; uVar1 < ai->mNumCameras; uVar1 = uVar1 + 1) {
      Write(out,ai->mCameras[uVar1],true);
    }
    JSONWriter::EndArray(out);
  }
  if ((ai->mTextures != (aiTexture **)0x0) && (ai->mNumTextures != 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"textures",&local_41);
    JSONWriter::Key(out,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    JSONWriter::StartArray(out,false);
    for (uVar1 = 0; uVar1 < ai->mNumTextures; uVar1 = uVar1 + 1) {
      Write(out,ai->mTextures[uVar1],true);
    }
    JSONWriter::EndArray(out);
  }
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiScene& ai) {
    out.StartObj();

    out.Key("__metadata__");
    WriteFormatInfo(out);

    out.Key("rootnode");
    Write(out, *ai.mRootNode, false);

    out.Key("flags");
    out.SimpleValue(ai.mFlags);

    if (ai.HasMeshes()) {
        out.Key("meshes");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumMeshes; ++n) {
            Write(out, *ai.mMeshes[n]);
        }
        out.EndArray();
    }

    if (ai.HasMaterials()) {
        out.Key("materials");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumMaterials; ++n) {
            Write(out, *ai.mMaterials[n]);
        }
        out.EndArray();
    }

    if (ai.HasAnimations()) {
        out.Key("animations");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumAnimations; ++n) {
            Write(out, *ai.mAnimations[n]);
        }
        out.EndArray();
    }

    if (ai.HasLights()) {
        out.Key("lights");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumLights; ++n) {
            Write(out, *ai.mLights[n]);
        }
        out.EndArray();
    }

    if (ai.HasCameras()) {
        out.Key("cameras");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumCameras; ++n) {
            Write(out, *ai.mCameras[n]);
        }
        out.EndArray();
    }

    if (ai.HasTextures()) {
        out.Key("textures");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumTextures; ++n) {
            Write(out, *ai.mTextures[n]);
        }
        out.EndArray();
    }
    out.EndObj();
}